

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void prvTidyInsertNodeAtEnd(Node *element,Node *node)

{
  Node *local_20;
  Node *node_local;
  Node *element_local;
  
  node->parent = element;
  if (element == (Node *)0x0) {
    local_20 = (Node *)0x0;
  }
  else {
    local_20 = element->last;
  }
  node->prev = local_20;
  if ((element == (Node *)0x0) || (element->last == (Node *)0x0)) {
    if (element != (Node *)0x0) {
      element->content = node;
    }
  }
  else {
    element->last->next = node;
  }
  if (element != (Node *)0x0) {
    element->last = node;
  }
  return;
}

Assistant:

void TY_(InsertNodeAtEnd)(Node *element, Node *node)
{
    node->parent = element;
    node->prev = element ? element->last : NULL;

    if (element && element->last != NULL)
        element->last->next = node;
    else
        if (element)
            element->content = node;

    if (element)
        element->last = node;
}